

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::RepeatedFieldHelper<11>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  int iVar1;
  RepeatedPtrFieldBase *x;
  ArrayOutput *in_RSI;
  void *in_RDI;
  int i;
  MessageLite *unaff_retaddr;
  RepeatedPtrFieldBase *array;
  int iVar2;
  int idx;
  
  x = Get<google::protobuf::internal::RepeatedPtrFieldBase>(in_RDI);
  iVar2 = 0;
  while( true ) {
    idx = iVar2;
    iVar1 = AccessorHelper::Size((RepeatedPtrFieldBase *)0x3c2a1b);
    if (iVar1 <= iVar2) break;
    WriteTagTo<google::protobuf::internal::ArrayOutput>
              ((uint32)((ulong)x >> 0x20),(ArrayOutput *)CONCAT44(idx,iVar2));
    AccessorHelper::Get(x,idx);
    SerializeMessageTo<google::protobuf::internal::ArrayOutput>(unaff_retaddr,in_RDI,in_RSI);
    iVar2 = idx + 1;
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeMessageTo(
          static_cast<const MessageLite*>(AccessorHelper::Get(array, i)),
          md.ptr, output);
    }
  }